

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initsout.c
# Opt level: O0

LispPTR * fixp_value(LispPTR *ptr)

{
  uint LAddr;
  LispPTR LAddr_00;
  LispPTR *newcell;
  LispPTR newval;
  LispPTR val;
  LispPTR *ptr_local;
  
  LAddr = *ptr;
  if (LAddr < 0xfffff) {
    LAddr_00 = N_OP_createcell(0xe0002);
    ptr_local = NativeAligned4FromLAddr(LAddr_00);
    *ptr_local = LAddr & 0xffff;
    *ptr = LAddr_00;
    if (((*(ushort *)((ulong)(MDStypetbl + (LAddr_00 >> 9)) ^ 2) & 0x8000) == 0) &&
       (*GcDisabled_word != 0x4c)) {
      if (*Reclaim_cnt_word == 0) {
        rec_htfind(LAddr_00,0);
      }
      else {
        htfind(LAddr_00,0);
      }
    }
  }
  else {
    ptr_local = NativeAligned4FromLAddr(LAddr);
  }
  return ptr_local;
}

Assistant:

LispPTR *fixp_value(LispPTR *ptr) {
  LispPTR val = *ptr;

  if (val < (S_NEGATIVE | 0xFFFF)) {
    LispPTR newval = N_OP_createcell(S_POSITIVE | TYPE_FIXP);
    LispPTR *newcell;
    newcell = (LispPTR *)NativeAligned4FromLAddr(newval);
    *newcell = val & 0xFFFF; /* it was smallp, so fill in */
    *ptr = newval;
    GCLOOKUP(newval, ADDREF); /* so it has a refcount */
    return ((LispPTR *)newcell);
  }
  return ((LispPTR *)NativeAligned4FromLAddr(val));
}